

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O1

int run_test_udp_options6(void)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  undefined1 *puVar4;
  undefined8 uVar5;
  ushort *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  bool bVar13;
  sockaddr_in6 addr;
  undefined1 auStack_1f0 [216];
  undefined1 auStack_118 [216];
  code *pcStack_40;
  int local_2c;
  sockaddr local_28 [2];
  
  pcStack_40 = (code *)0x17b919;
  iVar2 = uv_interface_addresses(local_28,&local_2c);
  if (iVar2 != 0) {
LAB_0017b98f:
    pcStack_40 = (code *)0x17b994;
    run_test_udp_options6_cold_1();
    return 1;
  }
  if ((long)local_2c < 1) {
    pcStack_40 = (code *)0x17b98f;
    uv_free_interface_addresses();
    goto LAB_0017b98f;
  }
  puVar6 = (ushort *)(local_28[0]._0_8_ + 0x14);
  uVar3 = 1;
  do {
    uVar1 = *puVar6;
    if (uVar1 == 10) break;
    puVar6 = puVar6 + 0x28;
    bVar13 = uVar3 < (ulong)(long)local_2c;
    uVar3 = uVar3 + 1;
  } while (bVar13);
  pcStack_40 = (code *)0x17b958;
  uv_free_interface_addresses(local_28[0]._0_8_);
  if (uVar1 != 10) goto LAB_0017b98f;
  pcStack_40 = (code *)0x17b974;
  iVar2 = uv_ip6_addr("::",0x23a3,local_28);
  if (iVar2 == 0) {
    pcStack_40 = (code *)0x17b982;
    udp_options_test(local_28);
    return 0;
  }
  pcStack_40 = run_test_udp_no_autobind;
  run_test_udp_options6_cold_2();
  puVar8 = auStack_1f0;
  puVar11 = auStack_1f0;
  puVar9 = auStack_1f0;
  puVar12 = auStack_1f0;
  puVar10 = auStack_1f0;
  pcStack_40 = (code *)(ulong)uVar1;
  puVar4 = (undefined1 *)uv_default_loop();
  puVar7 = puVar4;
  iVar2 = uv_udp_init(puVar4,auStack_118);
  if (iVar2 == 0) {
    puVar7 = auStack_118;
    iVar2 = uv_udp_set_multicast_ttl(puVar7,0x20);
    if (iVar2 != -9) goto LAB_0017bb3f;
    puVar7 = auStack_118;
    iVar2 = uv_udp_set_broadcast(puVar7,1);
    if (iVar2 != -9) goto LAB_0017bb44;
    puVar7 = auStack_118;
    iVar2 = uv_udp_set_ttl(puVar7,1);
    if (iVar2 != -9) goto LAB_0017bb49;
    puVar7 = auStack_118;
    iVar2 = uv_udp_set_multicast_loop(puVar7,1);
    if (iVar2 != -9) goto LAB_0017bb4e;
    puVar7 = auStack_118;
    iVar2 = uv_udp_set_multicast_interface(puVar7,"0.0.0.0");
    if (iVar2 != -9) goto LAB_0017bb53;
    uv_close(auStack_118,0);
    puVar7 = puVar4;
    iVar2 = uv_udp_init_ex(puVar4,auStack_1f0,2);
    if (iVar2 != 0) goto LAB_0017bb58;
    iVar2 = uv_udp_set_multicast_ttl(auStack_1f0,0x20);
    puVar7 = puVar8;
    if (iVar2 != 0) goto LAB_0017bb5d;
    iVar2 = uv_udp_set_broadcast(auStack_1f0,1);
    if (iVar2 != 0) goto LAB_0017bb62;
    iVar2 = uv_udp_set_ttl(auStack_1f0,1);
    puVar11 = puVar9;
    if (iVar2 != 0) goto LAB_0017bb67;
    iVar2 = uv_udp_set_multicast_loop(auStack_1f0,1);
    if (iVar2 != 0) goto LAB_0017bb6c;
    iVar2 = uv_udp_set_multicast_interface(auStack_1f0,"0.0.0.0");
    puVar12 = puVar10;
    if (iVar2 != 0) goto LAB_0017bb71;
    uv_close(auStack_1f0,0);
    iVar2 = uv_run(puVar4,0);
    if (iVar2 == 0) {
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      puVar4 = (undefined1 *)uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0017bb7b;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_0017bb3f:
    run_test_udp_no_autobind_cold_2();
LAB_0017bb44:
    run_test_udp_no_autobind_cold_3();
LAB_0017bb49:
    run_test_udp_no_autobind_cold_4();
LAB_0017bb4e:
    run_test_udp_no_autobind_cold_5();
LAB_0017bb53:
    run_test_udp_no_autobind_cold_6();
LAB_0017bb58:
    run_test_udp_no_autobind_cold_7();
LAB_0017bb5d:
    puVar11 = puVar7;
    run_test_udp_no_autobind_cold_8();
LAB_0017bb62:
    run_test_udp_no_autobind_cold_9();
LAB_0017bb67:
    puVar12 = puVar11;
    run_test_udp_no_autobind_cold_10();
LAB_0017bb6c:
    run_test_udp_no_autobind_cold_11();
LAB_0017bb71:
    puVar4 = puVar12;
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_0017bb7b:
  run_test_udp_no_autobind_cold_14();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(puVar4,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(udp_options6) {
  struct sockaddr_in6 addr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));
  return udp_options_test((const struct sockaddr*) &addr);
}